

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O0

void __thiscall
USBAnalyzerResults::GenerateExportFileSignals
          (USBAnalyzerResults *this,char *file,DisplayBase display_base)

{
  long lVar1;
  long lVar2;
  undefined2 uVar3;
  byte bVar4;
  uint uVar5;
  ulonglong uVar6;
  ostream *poVar7;
  Frame local_320 [8];
  long lStack_318;
  long local_310;
  undefined2 local_300;
  ulong local_2f8;
  U64 fcnt;
  U64 num_frames;
  char time_str [128];
  Frame f;
  char local_248;
  U32 sample_rate;
  U64 trigger_sample;
  ofstream file_stream;
  DisplayBase display_base_local;
  char *file_local;
  USBAnalyzerResults *this_local;
  
  std::ofstream::ofstream(&trigger_sample,file,_S_out);
  uVar6 = Analyzer::GetTriggerSample();
  uVar5 = Analyzer::GetSampleRate();
  poVar7 = std::operator<<((ostream *)&trigger_sample,"Time [s],Signal,Duration [ns]");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  Frame::Frame((Frame *)(time_str + 0x78));
  num_frames._0_1_ = 0;
  fcnt = AnalyzerResults::GetNumFrames();
  for (local_2f8 = 0; local_2f8 < fcnt; local_2f8 = local_2f8 + 1) {
    AnalyzerResults::GetFrame((ulonglong)local_320);
    uVar3 = local_300;
    lVar2 = local_310;
    lVar1 = lStack_318;
    time_str[0x78] = (char)local_320[0];
    time_str[0x79] = (char)local_320[1];
    time_str[0x7a] = (char)local_320[2];
    time_str[0x7b] = (char)local_320[3];
    time_str[0x7c] = (char)local_320[4];
    time_str[0x7d] = (char)local_320[5];
    time_str[0x7e] = (char)local_320[6];
    time_str[0x7f] = (char)local_320[7];
    Frame::~Frame(local_320);
    bVar4 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,local_2f8);
    if ((bVar4 & 1) != 0) goto LAB_00153eb3;
    AnalyzerHelpers::GetTimeString(time_str._120_8_,uVar6,uVar5,(char *)&num_frames,0x80);
    poVar7 = std::operator<<((ostream *)&trigger_sample,(char *)&num_frames);
    std::operator<<(poVar7,",");
    local_248 = (char)uVar3;
    if (local_248 == '\0') {
      if (lVar2 == 1) {
        std::operator<<((ostream *)&trigger_sample,'J');
      }
      else if (lVar2 == 0) {
        std::operator<<((ostream *)&trigger_sample,'K');
      }
      else if (lVar2 == 2) {
        std::operator<<((ostream *)&trigger_sample,"SE0");
      }
      else if (lVar2 == 3) {
        std::operator<<((ostream *)&trigger_sample,"SE1");
      }
      poVar7 = std::operator<<((ostream *)&trigger_sample,',');
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,(double)(lVar1 - time_str._120_8_) / ((double)uVar5 / 1000000000.0)
                         );
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,fcnt);
LAB_00153eb3:
  Frame::~Frame((Frame *)(time_str + 0x78));
  std::ofstream::~ofstream(&trigger_sample);
  return;
}

Assistant:

void USBAnalyzerResults::GenerateExportFileSignals( const char* file, DisplayBase display_base )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    // header
    file_stream << "Time [s],Signal,Duration [ns]" << std::endl;

    Frame f;
    char time_str[ 128 ];
    time_str[ 0 ] = '\0';
    const U64 num_frames = GetNumFrames();
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        f = GetFrame( fcnt );

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;

        // make the time string
        AnalyzerHelpers::GetTimeString( f.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, sizeof( time_str ) );

        // output timestamp
        file_stream << time_str << ",";

        // start of a new packet?
        if( f.mType == FT_Signal )
        {
            if( f.mData1 == S_J )
                file_stream << 'J';
            else if( f.mData1 == S_K )
                file_stream << 'K';
            else if( f.mData1 == S_SE0 )
                file_stream << "SE0";
            else if( f.mData1 == S_SE1 )
                file_stream << "SE1";

            file_stream << ',' << ( f.mEndingSampleInclusive - f.mStartingSampleInclusive ) / ( sample_rate / 1e9 ) << std::endl;
        }
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}